

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

void __thiscall FfsParser::~FfsParser(FfsParser *this)

{
  NvramParser *pNVar1;
  MeParser *pMVar2;
  FitParser *this_00;
  pointer pcVar3;
  
  pNVar1 = this->nvramParser;
  if (pNVar1 != (NvramParser *)0x0) {
    std::
    vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
    ::~vector(&pNVar1->messagesVector);
    operator_delete(pNVar1);
  }
  pMVar2 = this->meParser;
  if (pMVar2 != (MeParser *)0x0) {
    std::
    vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
    ::~vector(&pMVar2->messagesVector);
    operator_delete(pMVar2);
  }
  this_00 = this->fitParser;
  if (this_00 != (FitParser *)0x0) {
    FitParser::~FitParser(this_00);
    operator_delete(this_00);
  }
  std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::~vector(&this->protectedRanges);
  Bstrlib::CBString::~CBString(&this->securityInfo);
  pcVar3 = (this->openedImage).d._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->openedImage).d.field_2) {
    operator_delete(pcVar3);
  }
  std::
  vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  ::~vector(&this->messagesVector);
  return;
}

Assistant:

FfsParser::~FfsParser() {
    delete nvramParser;
    delete meParser;
    delete fitParser;
}